

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookptravltree.h
# Opt level: O2

int __thiscall cookmem::PtrAVLTree::remove(PtrAVLTree *this,char *__filename)

{
  ulong uVar1;
  Node *pNVar2;
  Node *next;
  Node *root;
  short sVar3;
  long lVar4;
  Node *apNStack_40218 [32768];
  Node *stack [65];
  
  root = this->m_root;
  if (root != (Node *)0x0) {
    stack[0] = root;
    uVar1 = *(ulong *)__filename;
    sVar3 = -1;
    while (root != (Node *)0x0) {
      lVar4 = 0x10;
      if ((root->size <= uVar1) && (lVar4 = 0x18, uVar1 <= root->size)) {
        sVar3 = sVar3 + 1;
        goto LAB_0010848b;
      }
      root = *(Node **)((long)&root->reserved + lVar4);
      stack[(long)(short)(sVar3 + 1) + 1] = root;
      sVar3 = sVar3 + 1;
    }
    root = stack[sVar3];
    if (uVar1 <= root->size) {
LAB_0010848b:
      pNVar2 = root->next;
      if (pNVar2 == (Node *)0x0) {
        removeNode(this,root,stack,(int)sVar3);
      }
      else {
        root->next = pNVar2->next;
        root = pNVar2;
      }
      *(size_t *)__filename = root->size;
      goto LAB_001084b6;
    }
    if (sVar3 != 0) {
      sVar3 = sVar3 + -1;
      root = stack[sVar3];
      if (uVar1 <= root->size) goto LAB_0010848b;
    }
  }
  root = (Node *)0x0;
LAB_001084b6:
  return (int)root;
}

Assistant:

void*
    remove (std::size_t& size)
    {
        Node* root;
        Node* stack[sizeof(Node*) * 8 + 1];
        std::int16_t depth;

        if (m_root == nullptr)
        {
            return nullptr;
        }

        root = stack[0] = m_root;

        for (depth = 0; ; ++depth)
        {
            if (root == nullptr)
            {
                --depth;
                root = stack[depth];
                if (size > root->size)
                {
                    // check if the parent is also smaller.
                    if (depth == 0)
                    {
                        return nullptr;
                    }

                    --depth;
                    root = stack[depth];
                    if (size > root->size)
                    {
                        return nullptr;
                    }
                    break;
                }
                break;
            }

            if (size < root->size)
            {
                root = stack[depth + 1] = root->left;
                continue;
            }
            else if (size > root->size)
            {
                root = stack[depth + 1] = root->right;
                continue;
            }

            break;
        }

        // At this point, this node's size is the smallest size
        // larger than or equal to rs.size.
        if (root->next)
        {
            // This is a simple case of having SLL of similar sized nodes.
            // just remove one from the SLL.
            Node* next = root->next;
            root->next = next->next;

            size = next->size;
            return next;
        }

        removeNode (root, stack, depth);
        size = root->size;
        return root;
    }